

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateUpsampleLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  int iVar3;
  UpsampleLayerParams_InterpolationMode UVar4;
  UpsampleLayerParams_LinearUpsampleMode UVar5;
  UpsampleLayerParams *this_00;
  string *psVar6;
  bool local_253;
  bool local_252;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  string err_2;
  undefined1 local_1a0 [8];
  string err_1;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string err;
  bool validScalingFactors;
  UpsampleLayerParams *params;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar1 = local_20;
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Upsample",&local_61)
        ;
        validateInputOutputRankEquality
                  (__return_storage_ptr__,pNVar1,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        pNVar1 = local_20;
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_62 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"Upsample",(allocator<char> *)((long)&params + 7));
        validateRankCount(__return_storage_ptr__,pNVar1,&local_88,3,-1,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_62 = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_62 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
      }
      this_00 = Specification::NeuralNetworkLayer::upsample(local_20);
      iVar3 = Specification::UpsampleLayerParams::scalingfactor_size(this_00);
      if (iVar3 == 0) {
        iVar3 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(this_00);
        local_252 = true;
        if (iVar3 != 0) {
          iVar3 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(this_00);
          local_252 = iVar3 == 2;
        }
        err.field_2._M_local_buf[0xf] = local_252;
      }
      else {
        iVar3 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(this_00);
        local_253 = false;
        if (iVar3 == 0) {
          iVar3 = Specification::UpsampleLayerParams::scalingfactor_size(this_00);
          local_253 = iVar3 == 2;
        }
        err.field_2._M_local_buf[0xf] = local_253;
      }
      if (err.field_2._M_local_buf[0xf] == '\0') {
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
        std::operator+(&local_140,"Invalid scaling factor in upsampling layer \'",psVar6);
        std::operator+(&local_120,&local_140,
                       "\'. Only one of scalingFactor and fractionalScalingFactor can be set, and if set, must be of size 2. Found scalingFactor of size "
                      );
        iVar3 = Specification::UpsampleLayerParams::scalingfactor_size(this_00);
        std::__cxx11::to_string(&local_160,iVar3);
        std::operator+(&local_100,&local_120,&local_160);
        std::operator+(&local_e0,&local_100," and fractionalScalingFactor of size ");
        iVar3 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(this_00);
        std::__cxx11::to_string((string *)((long)&err_1.field_2 + 8),iVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,&local_e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&err_1.field_2 + 8));
        std::__cxx11::string::~string((string *)(err_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c0);
        local_38 = 1;
        std::__cxx11::string::~string((string *)local_c0);
      }
      else {
        iVar3 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(this_00);
        if ((iVar3 == 2) &&
           ((UVar4 = Specification::UpsampleLayerParams::mode(this_00),
            UVar4 == UpsampleLayerParams_InterpolationMode_NN ||
            (UVar5 = Specification::UpsampleLayerParams::linearupsamplemode(this_00),
            UVar5 == UpsampleLayerParams_LinearUpsampleMode_DEFAULT)))) {
          psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          __return_storage_ptr___00 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&err_2.field_2 + 8);
          std::operator+(__return_storage_ptr___00,"Invalid upsample layer \'",psVar6);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0,__return_storage_ptr___00,
                         "\'. Fractional upsample only compatible with align_corners=true or align_corners=false"
                        );
          std::__cxx11::string::~string((string *)(err_2.field_2._M_local_buf + 8));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1a0);
          local_38 = 1;
          std::__cxx11::string::~string((string *)local_1a0);
        }
        else {
          UVar5 = Specification::UpsampleLayerParams::linearupsamplemode(this_00);
          if ((UVar5 == UpsampleLayerParams_LinearUpsampleMode_DEFAULT) ||
             (UVar4 = Specification::UpsampleLayerParams::mode(this_00),
             UVar4 != UpsampleLayerParams_InterpolationMode_NN)) {
            Result::Result(__return_storage_ptr__);
          }
          else {
            psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
            std::operator+(&local_200,"Layer \'",psVar6);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0,&local_200,
                           "\' of type Upsample uses Nearest Neighbors but uses linear upsampling mode other than DEFAULT."
                          );
            std::__cxx11::string::~string((string *)&local_200);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1e0);
            local_38 = 1;
            std::__cxx11::string::~string((string *)local_1e0);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateUpsampleLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Upsample", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Upsample", 3, -1, blobNameToRank));
    }

    const auto& params = layer.upsample();
    /* If scalingFactor or fractionalScalingFactor are provided, they must be mutually exclusive and of size 2.
                             scalingFactor
                             0 | 2 | Other
                      0      V   V   I
       fractionalSF   2      V   I   I
                      Other  I   I   I
     */
    bool validScalingFactors;
    if (params.scalingfactor_size() == 0) {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 || params.fractionalscalingfactor_size() == 2;
    } else {
        validScalingFactors = params.fractionalscalingfactor_size() == 0 && params.scalingfactor_size() == 2;
    }
    if (!validScalingFactors) {
        std::string err = "Invalid scaling factor in upsampling layer '" + layer.name()
            + "'. Only one of scalingFactor and fractionalScalingFactor can be set, and if set, must be of size 2. Found scalingFactor of size "
            + std::to_string(params.scalingfactor_size()) + " and fractionalScalingFactor of size " + std::to_string(params.fractionalscalingfactor_size());
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (params.fractionalscalingfactor_size() == 2
        && (params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN
            || params.linearupsamplemode() == Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT)) {
        std::string err = "Invalid upsample layer '" + layer.name() + "'. Fractional upsample only compatible with align_corners=true or align_corners=false";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if(params.linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT
       && params.mode() == Specification::UpsampleLayerParams_InterpolationMode_NN) {
        std::string err = "Layer '" + layer.name() + "' of type Upsample uses Nearest Neighbors but uses linear upsampling mode other than DEFAULT.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}